

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O1

Move * cuddZddLinearDown(DdManager *table,int x,int xHigh,Move *prevMoves)

{
  DdHalfWord y;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DdHalfWord DVar4;
  DdNode *pDVar5;
  uint uVar6;
  DdNode *pDVar7;
  
  uVar6 = table->keysZ;
  y = cuddZddNextHigh(table,x);
  while( true ) {
    if (xHigh < (int)y) {
      return (Move *)(DdNode *)prevMoves;
    }
    uVar1 = cuddZddSwapInPlace(table,x,y);
    if (((uVar1 == 0) || (uVar2 = cuddZddLinearInPlace(table,x,y), uVar2 == 0)) ||
       (pDVar5 = cuddDynamicAllocNode(table), pDVar5 == (DdNode *)0x0)) break;
    pDVar5->index = x;
    pDVar5->ref = y;
    (pDVar5->type).kids.T = (DdNode *)prevMoves;
    *(undefined4 *)&pDVar5->next = 0;
    prevMoves = (Move *)pDVar5;
    if ((int)uVar1 < (int)uVar2) {
      uVar3 = cuddZddLinearInPlace(table,x,y);
      if (uVar3 == 0) break;
      uVar2 = uVar1;
      if (uVar3 != uVar1) {
        fprintf((FILE *)table->err,"Change in size after identity transformation! From %d to %d\n",
                (ulong)uVar1,(ulong)uVar3);
      }
    }
    else {
      *(undefined4 *)&pDVar5->next = 1;
    }
    *(uint *)((long)&pDVar5->next + 4) = uVar2;
    if ((double)(int)uVar6 * table->maxGrowth < (double)(int)uVar2) {
      return (Move *)pDVar5;
    }
    if ((int)uVar2 < (int)uVar6) {
      uVar6 = uVar2;
    }
    DVar4 = cuddZddNextHigh(table,y);
    x = y;
    y = DVar4;
  }
  if ((DdNode *)prevMoves == (DdNode *)0x0) {
    return (Move *)0xffffffffffffffff;
  }
  pDVar5 = table->nextFree;
  do {
    pDVar7 = (DdNode *)prevMoves;
    prevMoves = (Move *)(pDVar7->type).kids.T;
    pDVar7->ref = 0;
    pDVar7->next = pDVar5;
    pDVar5 = pDVar7;
  } while ((DdNode *)prevMoves != (DdNode *)0x0);
  table->nextFree = pDVar7;
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move *
cuddZddLinearDown(
  DdManager * table,
  int  x,
  int  xHigh,
  Move * prevMoves)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size, newsize;
    int         limitSize;

    moves = prevMoves;
    limitSize = table->keysZ;

    y = cuddZddNextHigh(table, x);
    while (y <= xHigh) {
        size = cuddZddSwapInPlace(table, x, y);
        if (size == 0)
            goto cuddZddLinearDownOutOfMem;
        newsize = cuddZddLinearInPlace(table, x, y);
        if (newsize == 0)
            goto cuddZddLinearDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL)
            goto cuddZddLinearDownOutOfMem;
        move->x = x;
        move->y = y;
        move->next = moves;
        moves = move;
        move->flags = CUDD_SWAP_MOVE;
        if (newsize > size) {
            /* Undo transformation. The transformation we apply is
            ** its own inverse. Hence, we just apply the transformation
            ** again.
            */
            newsize = cuddZddLinearInPlace(table,x,y);
            if (newsize == 0) goto cuddZddLinearDownOutOfMem;
            if (newsize != size) {
                (void) fprintf(table->err,"Change in size after identity transformation! From %d to %d\n",size,newsize);
            }
        } else {
            size = newsize;
            move->flags = CUDD_LINEAR_TRANSFORM_MOVE;
        }
        move->size = size;

        if ((double)size > (double)limitSize * table->maxGrowth)
            break;
        if (size < limitSize)
            limitSize = size;

        x = y;
        y = cuddZddNextHigh(table, x);
    }
    return(moves);

cuddZddLinearDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}